

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O1

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,InstanceSymbol *symbol)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  PortConnection *this_00;
  group_type_pointer pgVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  bool bVar8;
  ulong pos0;
  Diagnostic *pDVar9;
  DefinitionSymbol *this_01;
  uint uVar10;
  long lVar11;
  ulong hash;
  ulong uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  undefined1 auVar17 [16];
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> sVar18;
  string_view sVar19;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  TimeTraceScope timeScope;
  locator res;
  TimeTraceScope local_71;
  InstanceBodySymbol *local_70;
  flat_hash_set<const_InstanceBodySymbol_*> *local_68;
  undefined1 local_60 [16];
  bool local_50;
  value_type_pointer local_48;
  ulong local_40;
  ulong local_38;
  
  if ((ulong)this->errorLimit < *this->numErrors) {
    return;
  }
  if ((this->hierarchyProblem & 1U) != 0) {
    return;
  }
  if ((this->visitInstances == false) && (((symbol->body->flags).m_bits & 2) != 0)) {
    return;
  }
  local_60._0_8_ = symbol;
  if (TimeTrace::profiler != 0) {
    detail.callable = (intptr_t)local_60;
    detail.callback =
         function_ref<std::__cxx11::string()>::
         callback_fn<slang::ast::DiagnosticVisitor::handle(slang::ast::InstanceSymbol_const&)::_lambda()_1_>
    ;
    sVar19._M_str = "AST Instance";
    sVar19._M_len = 0xc;
    TimeTrace::beginTrace(sVar19,detail);
  }
  sVar18 = InstanceSymbol::getPortConnections(symbol);
  if (sVar18._M_extent._M_extent_value._M_extent_value != 0) {
    lVar11 = 0;
    do {
      this_00 = *(PortConnection **)((long)sVar18._M_ptr + lVar11);
      PortConnection::getExpression(this_00);
      PortConnection::checkSimulatedNetTypes(this_00);
      lVar11 = lVar11 + 8;
    } while (sVar18._M_extent._M_extent_value._M_extent_value << 3 != lVar11);
  }
  local_68 = &this->activeInstanceBodies;
  local_70 = symbol->body;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_70;
  hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->activeInstanceBodies).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->activeInstanceBodies).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  local_48 = (this->activeInstanceBodies).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
             .arrays.elements_;
  local_40 = (this->activeInstanceBodies).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
             .arrays.groups_size_mask;
  uVar7 = 0;
  uVar12 = pos0;
  do {
    local_38 = uVar7;
    pgVar2 = pgVar4 + uVar12;
    uVar13 = (uchar)uVar3;
    auVar17[0] = -(pgVar2->m[0].n == uVar13);
    uVar14 = (uchar)((uint)uVar3 >> 8);
    auVar17[1] = -(pgVar2->m[1].n == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 0x10);
    auVar17[2] = -(pgVar2->m[2].n == uVar15);
    uVar16 = (uchar)((uint)uVar3 >> 0x18);
    auVar17[3] = -(pgVar2->m[3].n == uVar16);
    auVar17[4] = -(pgVar2->m[4].n == uVar13);
    auVar17[5] = -(pgVar2->m[5].n == uVar14);
    auVar17[6] = -(pgVar2->m[6].n == uVar15);
    auVar17[7] = -(pgVar2->m[7].n == uVar16);
    auVar17[8] = -(pgVar2->m[8].n == uVar13);
    auVar17[9] = -(pgVar2->m[9].n == uVar14);
    auVar17[10] = -(pgVar2->m[10].n == uVar15);
    auVar17[0xb] = -(pgVar2->m[0xb].n == uVar16);
    auVar17[0xc] = -(pgVar2->m[0xc].n == uVar13);
    auVar17[0xd] = -(pgVar2->m[0xd].n == uVar14);
    auVar17[0xe] = -(pgVar2->m[0xe].n == uVar15);
    auVar17[0xf] = -(pgVar2->m[0xf].n == uVar16);
    for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe); uVar10 != 0;
        uVar10 = uVar10 - 1 & uVar10) {
      uVar5 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      if (local_70 == local_48[uVar12 * 0xf + (ulong)uVar5]) {
        bVar8 = local_48 + uVar12 * 0xf + (ulong)uVar5 == (value_type_pointer)0x0;
        goto LAB_003e8849;
      }
    }
    bVar8 = true;
    if ((pgVar4[uVar12].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
    uVar12 = uVar12 + local_38 + 1 & local_40;
    uVar7 = local_38 + 1;
  } while (local_38 + 1 <= local_40);
LAB_003e8849:
  if (bVar8) {
    if ((this->activeInstanceBodies).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
        .size_ctrl.size <
        (this->activeInstanceBodies).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
      ::nosize_unchecked_emplace_at<slang::ast::InstanceBodySymbol_const*>
                ((locator *)local_60,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
                  *)local_68,(arrays_type *)local_68,pos0,hash,&local_70);
      psVar1 = &(this->activeInstanceBodies).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
      ::unchecked_emplace_with_rehash<slang::ast::InstanceBodySymbol_const*>
                ((locator *)local_60,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
                  *)local_68,hash,&local_70);
    }
    if (bVar8) {
      local_50 = true;
      local_60._0_8_ = this;
      local_60._8_8_ = symbol;
      if ((ulong)(this->compilation->options).maxInstanceDepth <
          (this->activeInstanceBodies).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
          .size_ctrl.size) {
        pDVar9 = Scope::addDiag((symbol->super_InstanceSymbolBase).super_Symbol.parentScope,
                                (DiagCode)0x25000d,
                                (symbol->super_InstanceSymbolBase).super_Symbol.location);
        this_01 = InstanceSymbol::getDefinition(symbol);
        sVar19 = DefinitionSymbol::getKindString(this_01);
        Diagnostic::operator<<(pDVar9,sVar19);
        local_70 = (InstanceBodySymbol *)(ulong)(this->compilation->options).maxInstanceDepth;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar9->args,(unsigned_long *)&local_70);
        this->hierarchyProblem = true;
      }
      else if ((this->visitInstances == true) && (bVar8 = tryApplyFromCache(this,symbol), !bVar8)) {
        handleDefault<slang::ast::InstanceBodySymbol>(this,symbol->body);
      }
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/ElabVisitors.h:369:33)>
      ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_ElabVisitors_h:369:33)>
                     *)local_60);
      goto LAB_003e893d;
    }
  }
  pDVar9 = Scope::addDiag((symbol->super_InstanceSymbolBase).super_Symbol.parentScope,
                          (DiagCode)0x24000d,
                          (symbol->super_InstanceSymbolBase).super_Symbol.location);
  Diagnostic::operator<<(pDVar9,(symbol->super_InstanceSymbolBase).super_Symbol.name);
  this->hierarchyProblem = true;
LAB_003e893d:
  TimeTraceScope::~TimeTraceScope(&local_71);
  return;
}

Assistant:

bool finishedEarly() const { return numErrors > errorLimit || hierarchyProblem; }